

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

void bluestein_fft(fft_data *data,fft_data *oup,fft_object obj,int sgn,int N)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  fft_data *oup_00;
  fft_data *oup_01;
  fft_data *hl;
  fft_data *oup_02;
  fft_data *hlt_00;
  double dVar6;
  double dVar7;
  fft_data *hlt;
  fft_data *yno;
  fft_data *tempop;
  fft_data *hk;
  fft_data *yn;
  double temp;
  double scale;
  int def_sgn;
  int def_N;
  int def_lt;
  int i;
  int ii;
  int M;
  int K;
  int N_local;
  int sgn_local;
  fft_object obj_local;
  fft_data *oup_local;
  fft_data *data_local;
  
  obj->lt = 0;
  dVar6 = log10((double)N);
  dVar7 = log10(2.0);
  dVar6 = ceil(dVar6 / dVar7);
  dVar6 = pow(2.0,dVar6);
  i = (int)dVar6;
  iVar3 = obj->sgn;
  iVar4 = obj->N;
  if (i < N * 2 + -2) {
    i = i << 1;
  }
  obj->N = i;
  oup_00 = (fft_data *)malloc((long)i << 4);
  oup_01 = (fft_data *)malloc((long)i << 4);
  hl = (fft_data *)malloc((long)i << 4);
  oup_02 = (fft_data *)malloc((long)i << 4);
  hlt_00 = (fft_data *)malloc((long)N << 4);
  bluestein_exp(hl,hlt_00,N,i);
  for (def_lt = 0; def_lt < i; def_lt = def_lt + 1) {
    hl[def_lt].im = (1.0 / (double)i) * hl[def_lt].im;
    hl[def_lt].re = (1.0 / (double)i) * hl[def_lt].re;
  }
  fft_exec(obj,hl,oup_01);
  if (sgn == 1) {
    for (def_N = 0; iVar5 = N, def_N < N; def_N = def_N + 1) {
      hl[def_N].re = data[def_N].re * hlt_00[def_N].re + data[def_N].im * hlt_00[def_N].im;
      hl[def_N].im = -data[def_N].re * hlt_00[def_N].im + data[def_N].im * hlt_00[def_N].re;
    }
  }
  else {
    for (def_N = 0; iVar5 = N, def_N < N; def_N = def_N + 1) {
      hl[def_N].re = data[def_N].re * hlt_00[def_N].re + -(data[def_N].im * hlt_00[def_N].im);
      hl[def_N].im = data[def_N].re * hlt_00[def_N].im + data[def_N].im * hlt_00[def_N].re;
    }
  }
  while (def_N = iVar5, def_N < i) {
    hl[def_N].re = 0.0;
    hl[def_N].im = 0.0;
    iVar5 = def_N + 1;
  }
  fft_exec(obj,hl,oup_00);
  if (sgn == 1) {
    for (def_N = 0; def_N < i; def_N = def_N + 1) {
      dVar6 = oup_00[def_N].re;
      dVar7 = oup_01[def_N].re;
      dVar1 = oup_00[def_N].im;
      dVar2 = oup_01[def_N].im;
      oup_00[def_N].im = oup_00[def_N].re * oup_01[def_N].im + oup_00[def_N].im * oup_01[def_N].re;
      oup_00[def_N].re = dVar6 * dVar7 + -(dVar1 * dVar2);
    }
  }
  else {
    for (def_N = 0; def_N < i; def_N = def_N + 1) {
      dVar6 = oup_00[def_N].re;
      dVar7 = oup_01[def_N].re;
      dVar1 = oup_00[def_N].im;
      dVar2 = oup_01[def_N].im;
      oup_00[def_N].im = -oup_00[def_N].re * oup_01[def_N].im + oup_00[def_N].im * oup_01[def_N].re;
      oup_00[def_N].re = dVar6 * dVar7 + dVar1 * dVar2;
    }
  }
  for (def_lt = 0; def_lt < i; def_lt = def_lt + 1) {
    obj->twiddle[def_lt].im = -obj->twiddle[def_lt].im;
  }
  obj->sgn = -sgn;
  fft_exec(obj,oup_00,oup_02);
  if (sgn == 1) {
    for (def_N = 0; def_N < N; def_N = def_N + 1) {
      oup[def_N].re = oup_02[def_N].re * hlt_00[def_N].re + oup_02[def_N].im * hlt_00[def_N].im;
      oup[def_N].im = -oup_02[def_N].re * hlt_00[def_N].im + oup_02[def_N].im * hlt_00[def_N].re;
    }
  }
  else {
    for (def_N = 0; def_N < N; def_N = def_N + 1) {
      oup[def_N].re = oup_02[def_N].re * hlt_00[def_N].re + -(oup_02[def_N].im * hlt_00[def_N].im);
      oup[def_N].im = oup_02[def_N].re * hlt_00[def_N].im + oup_02[def_N].im * hlt_00[def_N].re;
    }
  }
  obj->sgn = iVar3;
  obj->N = iVar4;
  obj->lt = 1;
  for (def_lt = 0; def_lt < i; def_lt = def_lt + 1) {
    obj->twiddle[def_lt].im = -obj->twiddle[def_lt].im;
  }
  free(oup_00);
  free(oup_02);
  free(hl);
  free(oup_01);
  free(hlt_00);
  return;
}

Assistant:

static void bluestein_fft(fft_data *data, fft_data *oup,fft_object obj,int sgn, int N) {

	int K,M,ii,i;
	int def_lt,def_N,def_sgn;
	fft_type scale,temp;
	fft_data* yn;
	fft_data* hk;
	fft_data* tempop;
	fft_data* yno;
	fft_data* hlt;
	obj->lt = 0;
	K = (int) pow(2.0,ceil((double) log10((double) N)/log10((double) 2.0)));
	def_lt = 1;
	def_sgn = obj->sgn;
	def_N = obj->N;

	if (K < 2 * N - 2) {
		M = K * 2;
	} else {
		M = K;
	}
	obj->N = M;

	yn = (fft_data*) malloc (sizeof(fft_data) * M);
	hk = (fft_data*) malloc (sizeof(fft_data) * M);
	tempop = (fft_data*) malloc (sizeof(fft_data) * M);
	yno = (fft_data*) malloc (sizeof(fft_data) * M);
    hlt = (fft_data*) malloc (sizeof(fft_data) * N);
    //fft_data* twi = (fft_data*) malloc (sizeof(fft_data) * M);

    bluestein_exp(tempop,hlt,N,M);
    scale = 1.0/M;

    for (ii = 0; ii < M; ++ii) {
		tempop[ii].im *= scale;
		tempop[ii].re *= scale;
	}

	//fft_object obj = initialize_fft2(M,1);
	fft_exec(obj,tempop,hk);

    if (sgn == 1) {
		for (i = 0; i < N; i++) {
			tempop[i].re = data[i].re * hlt[i].re + data[i].im * hlt[i].im;
			tempop[i].im = -data[i].re * hlt[i].im + data[i].im * hlt[i].re;
		}
	} else {
		for (i = 0; i < N; i++) {
			tempop[i].re = data[i].re * hlt[i].re - data[i].im * hlt[i].im;
			tempop[i].im = data[i].re * hlt[i].im + data[i].im * hlt[i].re;
		}
	}

	for (i = N;i < M;i++) {
		tempop[i].re = 0.0;
		tempop[i].im = 0.0;
	}

	fft_exec(obj,tempop,yn);

	if (sgn == 1) {
		for (i = 0; i < M; i++) {
			temp = yn[i].re * hk[i].re - yn[i].im * hk[i].im;
			yn[i].im = yn[i].re * hk[i].im + yn[i].im * hk[i].re;
			yn[i].re = temp;
		}
	} else {
		for (i = 0; i < M; i++) {
			temp = yn[i].re * hk[i].re + yn[i].im * hk[i].im;
			yn[i].im = -yn[i].re * hk[i].im + yn[i].im * hk[i].re;
			yn[i].re = temp;
		}

	}

    //IFFT

    for (ii = 0; ii < M; ++ii) {
		(obj->twiddle+ii)->im = -(obj->twiddle+ii)->im;
	}

	obj->sgn = -1*sgn;

	fft_exec(obj,yn,yno);

	if (sgn == 1) {
		for (i = 0; i < N; i++) {
			oup[i].re = yno[i].re * hlt[i].re + yno[i].im * hlt[i].im;
			oup[i].im = -yno[i].re * hlt[i].im + yno[i].im * hlt[i].re;
		}
	} else {
		for (i = 0; i < N; i++) {
			oup[i].re = yno[i].re * hlt[i].re - yno[i].im * hlt[i].im;
			oup[i].im = yno[i].re * hlt[i].im + yno[i].im * hlt[i].re;
		}

	}

	obj->sgn = def_sgn;
	obj->N = def_N;
	obj->lt = def_lt;
	for (ii = 0; ii < M; ++ii) {
		(obj->twiddle+ii)->im = -(obj->twiddle+ii)->im;
	}

    free(yn);
    free(yno);
    free(tempop);
    free(hk);
    free(hlt);

}